

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O3

int __thiscall OctetType::serialise(OctetType *this,uint8_t *buf,size_t max_len)

{
  ulong uVar1;
  uint8_t *puVar2;
  uint8_t uVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = -0x1f;
  if (1 < max_len) {
    uVar1 = (this->_value)._M_string_length;
    *buf = (char)(this->super_BER_CONTAINER)._type;
    lVar5 = 2;
    puVar2 = buf + 1;
    if (0x7f < uVar1) {
      if (uVar1 < 0x101) {
        puVar2 = buf + 2;
        lVar5 = 3;
        uVar3 = 0x81;
      }
      else {
        puVar2 = buf + 3;
        buf[2] = (uint8_t)(uVar1 >> 8);
        lVar5 = 4;
        uVar3 = 0x82;
      }
      buf[1] = uVar3;
    }
    *puVar2 = (uint8_t)uVar1;
    if (uVar1 + lVar5 <= max_len) {
      memcpy(buf + lVar5,(this->_value)._M_dataplus._M_p,(this->_value)._M_string_length);
      iVar4 = ((int)(buf + lVar5) + (int)(this->_value)._M_string_length) - (int)buf;
    }
  }
  return iVar4;
}

Assistant:

int OctetType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, _value.length());
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    memcpy(ptr, _value.data(), _value.length());
    ptr += _value.length();

    return ptr - buf;
}